

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

int __thiscall Fl_X::set_cursor(Fl_X *this,Fl_RGB_Image *image,int hotx,int hoty)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  uint *puVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar9 = 0;
  iVar8 = 0;
  if ((((-1 < hotx) && (iVar8 = iVar9, -1 < hoty && hotx < (image->super_Fl_Image).w_)) &&
      (hoty < (image->super_Fl_Image).h_)) && (lVar2 = XcursorImageCreate(), lVar2 != 0)) {
    iVar8 = (image->super_Fl_Image).ld_;
    if (iVar8 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (long)(iVar8 - (image->super_Fl_Image).d_ * (image->super_Fl_Image).w_);
    }
    iVar8 = (image->super_Fl_Image).h_;
    if (0 < iVar8) {
      puVar5 = *(uint **)(lVar2 + 0x20);
      pbVar6 = (byte *)*(image->super_Fl_Image).data_;
      iVar9 = (image->super_Fl_Image).w_;
      iVar7 = 0;
      do {
        if (0 < iVar9) {
          uVar11 = (ulong)(uint)(image->super_Fl_Image).d_;
          iVar8 = 0;
          do {
            switch((int)uVar11) {
            case 1:
              uVar10 = (uint)*pbVar6 * 0x10101;
              goto LAB_001908e9;
            case 2:
              bVar1 = *pbVar6;
              uVar10 = (uint)bVar1 << 8 | (uint)bVar1 << 0x10 | (uint)pbVar6[1] << 0x18 |
                       (uint)bVar1;
              break;
            case 3:
              uVar10 = (uint)pbVar6[2] | (uint)pbVar6[1] << 8 | (uint)*pbVar6 << 0x10;
LAB_001908e9:
              uVar10 = uVar10 | 0xff000000;
              break;
            case 4:
              uVar10 = (uint)pbVar6[2] |
                       (uint)pbVar6[1] << 8 | (uint)*pbVar6 << 0x10 | (uint)pbVar6[3] << 0x18;
              break;
            default:
              goto switchD_001908bd_default;
            }
            *puVar5 = uVar10;
switchD_001908bd_default:
            uVar11 = (ulong)(image->super_Fl_Image).d_;
            pbVar6 = pbVar6 + uVar11;
            puVar5 = puVar5 + 1;
            iVar8 = iVar8 + 1;
            iVar9 = (image->super_Fl_Image).w_;
          } while (iVar8 < iVar9);
          iVar8 = (image->super_Fl_Image).h_;
        }
        pbVar6 = pbVar6 + lVar3;
        iVar7 = iVar7 + 1;
      } while (iVar7 < iVar8);
    }
    *(int *)(lVar2 + 0x10) = hotx;
    *(int *)(lVar2 + 0x14) = hoty;
    uVar4 = XcursorImageLoadCursor(fl_display,lVar2);
    XDefineCursor(fl_display,this->xid,uVar4);
    XFreeCursor(fl_display,uVar4);
    XcursorImageDestroy(lVar2);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Fl_X::set_cursor(const Fl_RGB_Image *image, int hotx, int hoty) {
#if ! HAVE_XCURSOR
  return 0;
#else
  XcursorImage *cursor;
  Cursor xc;

  if ((hotx < 0) || (hotx >= image->w()))
    return 0;
  if ((hoty < 0) || (hoty >= image->h()))
    return 0;

  cursor = XcursorImageCreate(image->w(), image->h());
  if (!cursor)
    return 0;

  const int extra_data = image->ld() ? (image->ld()-image->w()*image->d()) : 0;
  const uchar *i = (const uchar*)*image->data();
  XcursorPixel *o = cursor->pixels;
  for (int y = 0;y < image->h();y++) {
    for (int x = 0;x < image->w();x++) {
      switch (image->d()) {
      case 1:
        *o = (0xff<<24) | (i[0]<<16) | (i[0]<<8) | i[0];
        break;
      case 2:
        *o = (i[1]<<24) | (i[0]<<16) | (i[0]<<8) | i[0];
        break;
      case 3:
        *o = (0xff<<24) | (i[0]<<16) | (i[1]<<8) | i[2];
        break;
      case 4:
        *o = (i[3]<<24) | (i[0]<<16) | (i[1]<<8) | i[2];
        break;
      }
      i += image->d();
      o++;
    }
    i += extra_data;
  }

  cursor->xhot = hotx;
  cursor->yhot = hoty;

  xc = XcursorImageLoadCursor(fl_display, cursor);
  XDefineCursor(fl_display, xid, xc);
  XFreeCursor(fl_display, xc);

  XcursorImageDestroy(cursor);

  return 1;
#endif
}